

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::Postprocess_BuildScene(AMFImporter *this,aiScene *pScene)

{
  _List_node_base *p_Var1;
  CAMFImporter_NodeElement_Constellation *pConstellation;
  long *plVar2;
  undefined8 uVar3;
  aiNode *this_00;
  aiNode *paVar4;
  aiNode **ppaVar5;
  ulong uVar6;
  aiMesh **ppaVar7;
  aiTexture **ppaVar8;
  undefined8 *puVar9;
  aiMaterial **ppaVar10;
  long *plVar11;
  aiMaterial *this_01;
  runtime_error *this_02;
  _List_node_base *p_Var12;
  long *plVar13;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_> *plVar14
  ;
  uint uVar15;
  long lVar16;
  _List_node_base *p_Var17;
  const_iterator nl_it;
  undefined8 *puVar18;
  size_t __n;
  bool bVar19;
  list<aiNode_*,_std::allocator<aiNode_*>_> node_list;
  int repeat;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  meta_list;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> mesh_list;
  int mode;
  aiNode *tnode;
  _List_node_base *local_658;
  long local_640;
  list<aiNode_*,_std::allocator<aiNode_*>_> local_638;
  long *local_620;
  ulong local_618;
  long local_610;
  long lStack_608;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  local_600;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> local_5e8;
  long *local_5d0 [2];
  long local_5c0 [2];
  undefined4 local_5b0 [28];
  ios_base local_540 [264];
  undefined1 local_438 [1032];
  
  p_Var1 = (_List_node_base *)&local_638;
  local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node._M_size = 0;
  local_600.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_600;
  local_600.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node._M_size = 0;
  local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = p_Var1;
  local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = p_Var1;
  local_600.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_600.
       super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_5e8;
  local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_5e8;
  this_00 = (aiNode *)operator_new(0x478);
  paVar4 = this_00;
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  this_00->mParent = (aiNode *)0x0;
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x20;
  p_Var12 = (_List_node_base *)&this->mNodeElement_List;
  do {
    p_Var12 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                 *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    lVar16 = 0;
    if (p_Var12 == (_List_node_base *)&this->mNodeElement_List) break;
    lVar16 = (long)p_Var12[1]._M_next;
  } while (*(int *)(lVar16 + 8) != 9);
  if (lVar16 == 0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"Root(<amf>) element not found.","");
    std::runtime_error::runtime_error(this_02,(string *)local_438);
    *(undefined ***)this_02 = &PTR__runtime_error_007fa260;
    __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar18 = (undefined8 *)(lVar16 + 0x38);
  for (puVar9 = *(undefined8 **)(lVar16 + 0x38); puVar9 != puVar18; puVar9 = (undefined8 *)*puVar9)
  {
    if ((((CAMFImporter_NodeElement_Material *)puVar9[2])->super_CAMFImporter_NodeElement).Type ==
        ENET_Material) {
      paVar4 = (aiNode *)this;
      Postprocess_BuildMaterial(this,(CAMFImporter_NodeElement_Material *)puVar9[2]);
    }
  }
  for (puVar9 = (undefined8 *)*puVar18; puVar9 != puVar18; puVar9 = (undefined8 *)*puVar9) {
    if ((((CAMFImporter_NodeElement_Object *)puVar9[2])->super_CAMFImporter_NodeElement).Type ==
        ENET_Object) {
      local_438._0_8_ = (aiNode *)0x0;
      paVar4 = (aiNode *)this;
      Postprocess_BuildNodeAndObject
                (this,(CAMFImporter_NodeElement_Object *)puVar9[2],&local_5e8,(aiNode **)local_438);
      uVar3 = local_438._0_8_;
      if ((aiNode *)local_438._0_8_ != (aiNode *)0x0) {
        paVar4 = (aiNode *)operator_new(0x18);
        *(undefined8 *)((paVar4->mName).data + 0xc) = uVar3;
        std::__detail::_List_node_base::_M_hook((_List_node_base *)paVar4);
        local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
             local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
             + 1;
      }
    }
  }
  for (puVar9 = (undefined8 *)*puVar18; puVar9 != puVar18; puVar9 = (undefined8 *)*puVar9) {
    pConstellation = (CAMFImporter_NodeElement_Constellation *)puVar9[2];
    if ((pConstellation->super_CAMFImporter_NodeElement).Type == ENET_Constellation) {
      paVar4 = (aiNode *)this;
      Postprocess_BuildConstellation(this,pConstellation,&local_638);
    }
    if ((pConstellation->super_CAMFImporter_NodeElement).Type == ENET_Metadata) {
      paVar4 = (aiNode *)operator_new(0x18);
      *(CAMFImporter_NodeElement_Constellation **)((paVar4->mName).data + 0xc) = pConstellation;
      std::__detail::_List_node_base::_M_hook((_List_node_base *)paVar4);
      local_600.
      super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      ._M_impl._M_node._M_size =
           local_600.
           super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
           ._M_impl._M_node._M_size + 1;
    }
  }
  Postprocess_AddMetadata((AMFImporter *)paVar4,&local_600,pScene->mRootNode);
  p_Var12 = local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  do {
    local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var12;
    if (local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size < 2)
    break;
    for (; bVar19 = p_Var12 != p_Var1, p_Var17 = p_Var12, bVar19; p_Var12 = p_Var12->_M_next) {
      do {
        p_Var17 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var17->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next;
        if (p_Var17 == p_Var1) goto LAB_003ea4bd;
        paVar4 = aiNode::FindNode((aiNode *)p_Var17[1]._M_next,
                                  (char *)((long)&(p_Var12[1]._M_next)->_M_next + 4));
      } while (paVar4 == (aiNode *)0x0);
      local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
           local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size -
           1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var12,0x18);
      if (p_Var17 != p_Var1) break;
LAB_003ea4bd:
    }
    p_Var12 = local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
  } while (bVar19);
  p_Var12 = local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != p_Var1) {
    pScene->mRootNode->mNumChildren =
         (uint)local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size;
    paVar4 = pScene->mRootNode;
    ppaVar5 = (aiNode **)operator_new__((ulong)paVar4->mNumChildren << 3);
    paVar4->mChildren = ppaVar5;
    paVar4 = pScene->mRootNode;
    if (paVar4->mNumChildren != 0) {
      uVar6 = 0;
      do {
        p_Var12[1]._M_next[0x44]._M_prev = (_List_node_base *)paVar4;
        p_Var17 = p_Var12 + 1;
        p_Var12 = p_Var12->_M_next;
        pScene->mRootNode->mChildren[uVar6] = (aiNode *)p_Var17->_M_next;
        uVar6 = uVar6 + 1;
        paVar4 = pScene->mRootNode;
      } while (uVar6 < paVar4->mNumChildren);
    }
  }
  p_Var12 = local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_5e8) {
    pScene->mNumMeshes =
         (uint)local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
               _M_size;
    ppaVar7 = (aiMesh **)
              operator_new__((local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl._M_node._M_size & 0xffffffff) << 3);
    pScene->mMeshes = ppaVar7;
    if (pScene->mNumMeshes != 0) {
      uVar6 = 0;
      do {
        p_Var17 = p_Var12 + 1;
        p_Var12 = p_Var12->_M_next;
        pScene->mMeshes[uVar6] = (aiMesh *)p_Var17->_M_next;
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumMeshes);
    }
  }
  uVar6 = (this->mTexture_Converted).
          super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          ._M_impl._M_node._M_size;
  uVar15 = (uint)uVar6;
  pScene->mNumTextures = uVar15;
  if (uVar15 != 0) {
    ppaVar8 = (aiTexture **)operator_new__((uVar6 & 0xffffffff) << 3);
    plVar14 = &this->mTexture_Converted;
    pScene->mTextures = ppaVar8;
    p_Var12 = (plVar14->
              super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar14) {
      lVar16 = 0;
      do {
        puVar9 = (undefined8 *)operator_new(0x428);
        *puVar9 = 0;
        puVar9[3] = 0;
        *(undefined4 *)(puVar9 + 4) = 0;
        *(undefined1 *)((long)puVar9 + 0x24) = 0;
        memset((void *)((long)puVar9 + 0x25),0x1b,0x3ff);
        *(undefined4 *)(puVar9 + 1) = 0;
        *(undefined8 **)((long)pScene->mTextures + lVar16) = puVar9;
        **(undefined4 **)((long)pScene->mTextures + lVar16) = *(undefined4 *)&p_Var12[3]._M_next;
        *(undefined4 *)(*(long *)((long)pScene->mTextures + lVar16) + 4) =
             *(undefined4 *)&p_Var12[3]._M_prev;
        *(_List_node_base **)(*(long *)((long)pScene->mTextures + lVar16) + 0x18) =
             p_Var12[5]._M_prev;
        strcpy((char *)(*(long *)((long)pScene->mTextures + lVar16) + 8),
               (char *)((long)&p_Var12[4]._M_prev + 1));
        p_Var12 = p_Var12->_M_next;
        lVar16 = lVar16 + 8;
      } while (p_Var12 != (_List_node_base *)plVar14);
    }
    uVar6 = (this->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ._M_impl._M_node._M_size;
    pScene->mNumMaterials = (uint)uVar6;
    ppaVar10 = (aiMaterial **)operator_new__((uVar6 & 0xffffffff) << 3);
    pScene->mMaterials = ppaVar10;
    local_658 = (plVar14->
                super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                )._M_impl._M_node.super__List_node_base._M_next;
    if (local_658 != (_List_node_base *)plVar14) {
      local_640 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
        std::ios_base::~ios_base(local_540);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_5d0,0,(char *)0x0,0x6af171);
        plVar13 = plVar11 + 2;
        if ((long *)*plVar11 == plVar13) {
          local_610 = *plVar13;
          lStack_608 = plVar11[3];
          local_620 = &local_610;
        }
        else {
          local_610 = *plVar13;
          local_620 = (long *)*plVar11;
        }
        plVar2 = local_620;
        local_618 = plVar11[1];
        *plVar11 = (long)plVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        __n = local_618 & 0xffffffff;
        if ((local_618 & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        local_438._0_4_ = (int)__n;
        memcpy(local_438 + 4,local_620,__n);
        local_438[__n + 4] = 0;
        if (plVar2 != &local_610) {
          operator_delete(plVar2,local_610 + 1);
        }
        if (local_5d0[0] != local_5c0) {
          operator_delete(local_5d0[0],local_5c0[0] + 1);
        }
        local_5b0[0] = 0;
        local_620 = (long *)CONCAT44(local_620._4_4_,(uint)*(byte *)&local_658[4]._M_prev);
        this_01 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_01);
        pScene->mMaterials[local_640] = this_01;
        aiMaterial::AddProperty(pScene->mMaterials[local_640],(aiString *)local_438,"$tex.file",1,0)
        ;
        aiMaterial::AddBinaryProperty
                  (pScene->mMaterials[local_640],local_5b0,4,"$tex.op",1,0,aiPTI_Integer);
        aiMaterial::AddBinaryProperty
                  (pScene->mMaterials[local_640],&local_620,4,"$tex.mapmodeu",1,0,aiPTI_Integer);
        aiMaterial::AddBinaryProperty
                  (pScene->mMaterials[local_640],&local_620,4,"$tex.mapmodev",1,0,aiPTI_Integer);
        local_640 = local_640 + 1;
        local_658 = local_658->_M_next;
      } while (local_658 != (_List_node_base *)plVar14);
    }
  }
  p_Var12 = local_600.
            super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var17 = local_5e8.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
                   super__List_node_base._M_next, p_Var12 != (_List_node_base *)&local_600) {
    p_Var17 = (((_List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                 *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var12,0x18);
    p_Var12 = p_Var17;
  }
  while (p_Var12 = local_638.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                   super__List_node_base._M_next, p_Var17 != (_List_node_base *)&local_5e8) {
    p_Var12 = (((_List_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)&p_Var17->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
    operator_delete(p_Var17,0x18);
    p_Var17 = p_Var12;
  }
  while (p_Var12 != p_Var1) {
    p_Var17 = p_Var12->_M_next;
    operator_delete(p_Var12,0x18);
    p_Var12 = p_Var17;
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildScene(aiScene* pScene)
{
std::list<aiNode*> node_list;
std::list<aiMesh*> mesh_list;
std::list<CAMFImporter_NodeElement_Metadata*> meta_list;

	//
	// Because for AMF "material" is just complex colors mixing so aiMaterial will not be used.
	// For building aiScene we are must to do few steps:
	// at first creating root node for aiScene.
	pScene->mRootNode = new aiNode;
	pScene->mRootNode->mParent = nullptr;
	pScene->mFlags |= AI_SCENE_FLAGS_ALLOW_SHARED;
	// search for root(<amf>) element
	CAMFImporter_NodeElement* root_el = nullptr;

	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if(ne->Type != CAMFImporter_NodeElement::ENET_Root) continue;

		root_el = ne;

		break;
	}// for(const CAMFImporter_NodeElement* ne: mNodeElement_List)

	// Check if root element are found.
	if(root_el == nullptr) throw DeadlyImportError("Root(<amf>) element not found.");

	// after that walk through children of root and collect data. Five types of nodes can be placed at top level - in <amf>: <object>, <material>, <texture>,
	// <constellation> and <metadata>. But at first we must read <material> and <texture> because they will be used in <object>. <metadata> can be read
	// at any moment.
	//
	// 1. <material>
	// 2. <texture> will be converted later when processing triangles list. \sa Postprocess_BuildMeshSet
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Material) Postprocess_BuildMaterial(*((CAMFImporter_NodeElement_Material*)root_child));
	}

	// After "appearance" nodes we must read <object> because it will be used in <constellation> -> <instance>.
	//
	// 3. <object>
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Object)
		{
			aiNode* tnode = nullptr;

			// for <object> mesh and node must be built: object ID assigned to aiNode name and will be used in future for <instance>
			Postprocess_BuildNodeAndObject(*((CAMFImporter_NodeElement_Object*)root_child), mesh_list, &tnode);
			if(tnode != nullptr) node_list.push_back(tnode);

		}
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// And finally read rest of nodes.
	//
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		// 4. <constellation>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Constellation)
		{
			// <object> and <constellation> at top of self abstraction use aiNode. So we can use only aiNode list for creating new aiNode's.
			Postprocess_BuildConstellation(*((CAMFImporter_NodeElement_Constellation*)root_child), node_list);
		}

		// 5, <metadata>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Metadata) meta_list.push_back((CAMFImporter_NodeElement_Metadata*)root_child);
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// at now we can add collected metadata to root node
	Postprocess_AddMetadata(meta_list, *pScene->mRootNode);
	//
	// Check constellation children
	//
	// As said in specification:
	// "When multiple objects and constellations are defined in a single file, only the top level objects and constellations are available for printing."
	// What that means? For example: if some object is used in constellation then you must show only constellation but not original object.
	// And at this step we are checking that relations.
nl_clean_loop:

	if(node_list.size() > 1)
	{
		// walk through all nodes
		for(std::list<aiNode*>::iterator nl_it = node_list.begin(); nl_it != node_list.end(); ++nl_it)
		{
			// and try to find them in another top nodes.
			std::list<aiNode*>::const_iterator next_it = nl_it;

			++next_it;
			for(; next_it != node_list.end(); ++next_it)
			{
				if((*next_it)->FindNode((*nl_it)->mName) != nullptr)
				{
					// if current top node(nl_it) found in another top node then erase it from node_list and restart search loop.
					node_list.erase(nl_it);

					goto nl_clean_loop;
				}
			}// for(; next_it != node_list.end(); next_it++)
		}// for(std::list<aiNode*>::const_iterator nl_it = node_list.begin(); nl_it != node_list.end(); nl_it++)
	}

	//
	// move created objects to aiScene
	//
	//
	// Nodes
	if(!node_list.empty())
	{
		std::list<aiNode*>::const_iterator nl_it = node_list.begin();

		pScene->mRootNode->mNumChildren = static_cast<unsigned int>(node_list.size());
		pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
		for(size_t i = 0; i < pScene->mRootNode->mNumChildren; i++)
		{
			// Objects and constellation that must be showed placed at top of hierarchy in <amf> node. So all aiNode's in node_list must have
			// mRootNode only as parent.
			(*nl_it)->mParent = pScene->mRootNode;
			pScene->mRootNode->mChildren[i] = *nl_it++;
		}
	}// if(node_list.size() > 0)

	//
	// Meshes
	if(!mesh_list.empty())
	{
		std::list<aiMesh*>::const_iterator ml_it = mesh_list.begin();

		pScene->mNumMeshes = static_cast<unsigned int>(mesh_list.size());
		pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
		for(size_t i = 0; i < pScene->mNumMeshes; i++) pScene->mMeshes[i] = *ml_it++;
	}// if(mesh_list.size() > 0)

	//
	// Textures
	pScene->mNumTextures = static_cast<unsigned int>(mTexture_Converted.size());
	if(pScene->mNumTextures > 0)
	{
		size_t idx;

		idx = 0;
		pScene->mTextures = new aiTexture*[pScene->mNumTextures];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			pScene->mTextures[idx] = new aiTexture;
			pScene->mTextures[idx]->mWidth = static_cast<unsigned int>(tex_convd.Width);
			pScene->mTextures[idx]->mHeight = static_cast<unsigned int>(tex_convd.Height);
			pScene->mTextures[idx]->pcData = (aiTexel*)tex_convd.Data;
			// texture format description.
			strcpy(pScene->mTextures[idx]->achFormatHint, tex_convd.FormatHint);
			idx++;
		}// for(const SPP_Texture& tex_convd: mTexture_Converted)

		// Create materials for embedded textures.
		idx = 0;
		pScene->mNumMaterials = static_cast<unsigned int>(mTexture_Converted.size());
		pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			const aiString texture_id(AI_EMBEDDED_TEXNAME_PREFIX + to_string(idx));
			const int mode = aiTextureOp_Multiply;
			const int repeat = tex_convd.Tiled ? 1 : 0;

			pScene->mMaterials[idx] = new aiMaterial;
			pScene->mMaterials[idx]->AddProperty(&texture_id, AI_MATKEY_TEXTURE_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			idx++;
		}
	}// if(pScene->mNumTextures > 0)
}